

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegStreamReader.cpp
# Opt level: O0

void __thiscall MPEGStreamReader::checkPulldownSync(MPEGStreamReader *this)

{
  ostream *poVar1;
  long lVar2;
  long local_18;
  int64_t asyncValue;
  MPEGStreamReader *this_local;
  
  local_18 = this->m_curDts * 5 + this->m_testPulldownDts * -4;
  if (local_18 < 0) {
    local_18 = -local_18;
  }
  if ((this->m_testPulldownDts != 0) &&
     (lVar2 = this->m_pulldownWarnCnt * 500000000,
     local_18 != lVar2 &&
     SBORROW8(local_18,lVar2) == local_18 + this->m_pulldownWarnCnt * -500000000 < 0)) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Warning! Source stream contain irregular pulldown marks. Mistiming between original fps and fps/1.25 (without pulldown) exceeds "
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18 / 5000000);
    poVar1 = std::operator<<(poVar1,"ms.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    sLastMsg = true;
    this->m_pulldownWarnCnt = this->m_pulldownWarnCnt << 1;
  }
  return;
}

Assistant:

void MPEGStreamReader::checkPulldownSync()
{
    int64_t asyncValue = m_curDts * 5 - m_testPulldownDts * 4;
    if (asyncValue < 0)
        asyncValue = -asyncValue;

    if (m_testPulldownDts != 0 && asyncValue > 5 * MAX_PULLDOWN_ASYNC * m_pulldownWarnCnt)
    {
        LTRACE(LT_ERROR, 2,
               "Warning! Source stream contain irregular pulldown marks. Mistiming between original fps and "
               "fps/1.25 (without pulldown) exceeds "
                   << (asyncValue / 5000000ll) << "ms.");
        m_pulldownWarnCnt *= 2;
    }
}